

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Textures::CompressedSubImageTest::CompressedTextureSubImage<1u>
          (CompressedSubImageTest *this,GLint internalformat)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  bool bVar2;
  Enum<int,_2UL> local_1b8;
  Enum<int,_2UL> local_1a8;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_reference_size == 0) {
    bVar2 = true;
  }
  else {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x2d8))
              (this->m_to,0,0,4,internalformat,this->m_reference_size,this->m_reference);
    local_1a8.m_value = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    bVar2 = local_1a8.m_value == 0;
    if (!bVar2) {
      local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_198 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"glCompressedTextureSubImage1D unexpectedly generated error ",
                 0x3b);
      local_1a8.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1a8,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," during the test with internal format ",0x26);
      local_1b8.m_getName = glu::getTextureFormatName;
      local_1b8.m_value = internalformat;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Test fails.",0xd);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_120);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool CompressedSubImageTest::CompressedTextureSubImage<1>(glw::GLint internalformat)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Load texture image with tested function. */
	if (m_reference_size)
	{
		gl.compressedTextureSubImage1D(m_to, 0, 0, s_texture_width, internalformat, m_reference_size, m_reference);
	}
	else
	{
		/* For 1D version there is no specific compressed texture internal format spcified in OpenGL 4.5 core profile documentation.
		 Only implementation depended specific internalformats may provide this functionality. As a result there may be no reference data to be substituted.
		 Due to this reason there is no use of CompressedTextureSubImage1D and particulary it cannot be tested. */
		return true;
	}

	/* Check errors. */
	glw::GLenum error;

	if (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glCompressedTextureSubImage1D unexpectedly generated error "
			<< glu::getErrorStr(error) << " during the test with internal format "
			<< glu::getTextureFormatStr(internalformat) << ". Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}